

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::message_sign::test_method(message_sign *this)

{
  bool bVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  check_type cVar4;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  lazy_ostream local_120;
  undefined1 *local_110;
  char *local_108;
  assertion_result local_100;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  CKey privkey;
  string generated_signature;
  string expected_signature;
  string message;
  array<unsigned_char,_32UL> privkey_bytes;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  privkey_bytes._M_elems[0x10] = 0xb1;
  privkey_bytes._M_elems[0x11] = 0xf8;
  privkey_bytes._M_elems[0x12] = 0x98;
  privkey_bytes._M_elems[0x13] = '\x06';
  privkey_bytes._M_elems[0x14] = '\v';
  privkey_bytes._M_elems[0x15] = 0x98;
  privkey_bytes._M_elems[0x16] = 'H';
  privkey_bytes._M_elems[0x17] = 0x9f;
  privkey_bytes._M_elems[0x18] = 0xa3;
  privkey_bytes._M_elems[0x19] = '\t';
  privkey_bytes._M_elems[0x1a] = 0x84;
  privkey_bytes._M_elems[0x1b] = 'c';
  privkey_bytes._M_elems[0x1c] = 0xc0;
  privkey_bytes._M_elems[0x1d] = '\x03';
  privkey_bytes._M_elems[0x1e] = '(';
  privkey_bytes._M_elems[0x1f] = 'f';
  privkey_bytes._M_elems[0] = 0xd9;
  privkey_bytes._M_elems[1] = '\x7f';
  privkey_bytes._M_elems[2] = 'Q';
  privkey_bytes._M_elems[3] = '\b';
  privkey_bytes._M_elems[4] = 0xf1;
  privkey_bytes._M_elems[5] = '\x1c';
  privkey_bytes._M_elems[6] = 0xda;
  privkey_bytes._M_elems[7] = 'n';
  privkey_bytes._M_elems[8] = 0xee;
  privkey_bytes._M_elems[9] = 0xba;
  privkey_bytes._M_elems[10] = 0xaa;
  privkey_bytes._M_elems[0xb] = 'B';
  privkey_bytes._M_elems[0xc] = '\x0f';
  privkey_bytes._M_elems[0xd] = 0xef;
  privkey_bytes._M_elems[0xe] = '\a';
  privkey_bytes._M_elems[0xf] = '&';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,"Trust no one",(allocator<char> *)&expected_signature);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expected_signature,
             "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk="
             ,(allocator<char> *)&generated_signature);
  privkey.fCompressed = false;
  privkey.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  generated_signature._M_dataplus._M_p = (pointer)&generated_signature.field_2;
  generated_signature._M_string_length = 0;
  generated_signature.field_2._M_local_buf[0] = '\0';
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x653;
  file.m_begin = (iterator)&local_d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e8,msg);
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113f7f0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "Confirm the private key is invalid";
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_128 = "";
  pvVar2 = (iterator)0x2;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,&local_120,2,1,WARN,_cVar4,(size_t)&local_130,0x653);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x656;
  file_00.m_begin = (iterator)&local_140;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_150,
             msg_00);
  bVar1 = MessageSign(&privkey,&message,&generated_signature);
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113c4a8;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "Sign with an invalid private key";
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_158 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,&local_120,1,1,WARN,_cVar4,(size_t)&local_160,0x656);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  CKey::Set<unsigned_char_const*>(&privkey,privkey_bytes._M_elems,(uchar *)&local_38,true);
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x65b;
  file_01.m_begin = (iterator)&local_170;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_180,
             msg_01);
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
         )privkey.keydata._M_t.
          super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        )0x0);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113c4a8;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "Confirm the private key is valid";
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_188 = "";
  pvVar2 = (iterator)0x2;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,&local_120,2,1,WARN,_cVar4,(size_t)&local_190,0x65b);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  file_02.m_end = (iterator)0x65e;
  file_02.m_begin = (iterator)&local_1a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b0,
             msg_02);
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)MessageSign(&privkey,&message,&generated_signature);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113ae50;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "Sign with a valid private key";
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1b8 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,&local_120,1,1,WARN,_cVar4,(size_t)&local_1c0,0x65e);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar3;
  msg_03.m_begin = pvVar2;
  file_03.m_end = (iterator)0x660;
  file_03.m_begin = (iterator)&local_1d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1e0,
             msg_03);
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1e8 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_120,&local_1f0,0x660,1,2,&expected_signature,"expected_signature",
             &generated_signature,"generated_signature");
  std::__cxx11::string::~string((string *)&generated_signature);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&privkey.keydata);
  std::__cxx11::string::~string((string *)&expected_signature);
  std::__cxx11::string::~string((string *)&message);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(message_sign)
{
    const std::array<unsigned char, 32> privkey_bytes = {
        // just some random data
        // derived address from this private key: 15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs
        0xD9, 0x7F, 0x51, 0x08, 0xF1, 0x1C, 0xDA, 0x6E,
        0xEE, 0xBA, 0xAA, 0x42, 0x0F, 0xEF, 0x07, 0x26,
        0xB1, 0xF8, 0x98, 0x06, 0x0B, 0x98, 0x48, 0x9F,
        0xA3, 0x09, 0x84, 0x63, 0xC0, 0x03, 0x28, 0x66
    };

    const std::string message = "Trust no one";

    const std::string expected_signature =
        "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk=";

    CKey privkey;
    std::string generated_signature;

    BOOST_REQUIRE_MESSAGE(!privkey.IsValid(),
        "Confirm the private key is invalid");

    BOOST_CHECK_MESSAGE(!MessageSign(privkey, message, generated_signature),
        "Sign with an invalid private key");

    privkey.Set(privkey_bytes.begin(), privkey_bytes.end(), true);

    BOOST_REQUIRE_MESSAGE(privkey.IsValid(),
        "Confirm the private key is valid");

    BOOST_CHECK_MESSAGE(MessageSign(privkey, message, generated_signature),
        "Sign with a valid private key");

    BOOST_CHECK_EQUAL(expected_signature, generated_signature);
}